

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::WindingCase::iterate(WindingCase *this)

{
  int iVar1;
  TestLog *pTVar2;
  RenderContext *context;
  int iVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  deUint32 dVar7;
  Winding WVar8;
  undefined4 extraout_var;
  long lVar9;
  int iVar10;
  Surface *surface;
  void *__buf;
  ulong uVar11;
  int iVar12;
  ostringstream *poVar13;
  int iVar14;
  char *pcVar15;
  int iVar16;
  ulong uVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  allocator<char> local_24a;
  allocator<char> local_249;
  WindingCase *local_248;
  Surface rendered;
  VertexArray vao;
  string local_200;
  string local_1e0;
  RandomViewport viewport;
  MessageBuilder local_1b0;
  undefined4 extraout_var_00;
  
  pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  context = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar6 = (*context->_vptr_RenderContext[4])(context);
  dVar7 = deStringHash((this->super_TestCase).super_TestCase.super_TestNode.m_name._M_dataplus._M_p)
  ;
  gls::TextureTestUtil::RandomViewport::RandomViewport
            (&viewport,(RenderTarget *)CONCAT44(extraout_var,iVar6),0x40,0x40,dVar7);
  dVar7 = (((this->m_program).m_ptr)->m_program).m_program;
  iVar6 = (*context->_vptr_RenderContext[3])(context);
  lVar9 = CONCAT44(extraout_var_00,iVar6);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper(&vao,context);
  (**(code **)(lVar9 + 0x1a00))(viewport.x,viewport.y,viewport.width,viewport.height);
  (**(code **)(lVar9 + 0x1c0))(0x3f800000,0,0,0x3f800000);
  (**(code **)(lVar9 + 0x1680))(dVar7);
  (**(code **)(lVar9 + 0xfd8))(0x8e72,1);
  (**(code **)(lVar9 + 0x5e0))(0xb44);
  (**(code **)(lVar9 + 0xd8))(vao.super_ObjectWrapper.m_object);
  poVar13 = &local_1b0.m_str;
  local_1b0.m_log = pTVar2;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar13);
  std::operator<<((ostream *)poVar13,"Face culling enabled");
  tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar13);
  bVar5 = true;
  WVar8 = WINDING_CCW;
  local_248 = this;
  do {
    poVar13 = &local_1b0.m_str;
    if (WVar8 == WINDING_LAST) break;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar13);
    std::operator<<((ostream *)poVar13,"Setting glFrontFace(");
    pcVar15 = "GL_CCW";
    if (WVar8 == WINDING_CW) {
      pcVar15 = "GL_CW";
    }
    std::operator<<((ostream *)poVar13,pcVar15);
    std::operator<<((ostream *)&local_1b0.m_str,")");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
    (**(code **)(lVar9 + 0x6c0))(WVar8 == WINDING_CW ^ 0x901);
    (**(code **)(lVar9 + 0x188))(0x4000);
    (**(code **)(lVar9 + 0x538))(0xe,0,1);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Draw failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                    ,0xb07);
    getPixels(&rendered,context,&viewport);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1e0,"RenderedImage",&local_249);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,"Rendered Image",&local_24a);
    surface = &rendered;
    tcu::LogImage::LogImage
              ((LogImage *)&local_1b0,&local_1e0,&local_200,surface,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write((LogImage *)&local_1b0,(int)pTVar2,__buf,(size_t)surface);
    tcu::LogImage::~LogImage((LogImage *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_200);
    std::__cxx11::string::~string((string *)&local_1e0);
    iVar20 = rendered.m_height;
    iVar18 = rendered.m_width;
    iVar6 = rendered.m_height;
    if (rendered.m_height < rendered.m_width) {
      iVar6 = rendered.m_width;
    }
    iVar10 = 0;
    uVar11 = 0;
    if (0 < rendered.m_width) {
      uVar11 = (ulong)(uint)rendered.m_width;
    }
    iVar14 = 0;
    if (0 < rendered.m_height) {
      iVar14 = rendered.m_height;
    }
    iVar19 = 0;
    iVar12 = 0;
    for (iVar16 = 0; uVar17 = uVar11, iVar3 = iVar10, iVar16 != iVar14; iVar16 = iVar16 + 1) {
      while (uVar17 != 0) {
        iVar1 = *(int *)((long)rendered.m_pixels.m_ptr + (long)iVar3 * 4);
        iVar12 = iVar12 + (uint)(iVar1 == -1);
        iVar19 = iVar19 + (uint)(iVar1 == -0xffff01);
        uVar17 = uVar17 - 1;
        iVar3 = iVar3 + 1;
      }
      iVar10 = iVar10 + rendered.m_width;
    }
    iVar6 = iVar6 * 5;
    if (local_248->m_primitiveType != TESSPRIMITIVETYPE_TRIANGLES) {
      iVar6 = 0;
    }
    poVar13 = &local_1b0.m_str;
    local_1b0.m_log = pTVar2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar13);
    std::operator<<((ostream *)poVar13,"Note: got ");
    std::ostream::operator<<(poVar13,iVar12);
    std::operator<<((ostream *)poVar13," white and ");
    std::ostream::operator<<(poVar13,iVar19);
    std::operator<<((ostream *)poVar13," red pixels");
    tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    iVar20 = iVar20 * iVar18;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar13);
    iVar18 = iVar20 - (iVar19 + iVar12);
    if (iVar6 < iVar18) {
      poVar13 = &local_1b0.m_str;
      local_1b0.m_log = pTVar2;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar13);
      std::operator<<((ostream *)poVar13,"Failure: Got ");
      std::ostream::operator<<(poVar13,iVar18);
      std::operator<<((ostream *)poVar13," other than white or red pixels (maximum tolerance ");
      std::ostream::operator<<(poVar13,iVar6);
      std::operator<<((ostream *)poVar13,")");
      tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0040ac61:
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1b0.m_str);
      bVar4 = false;
      bVar5 = false;
    }
    else if (WVar8 == local_248->m_winding) {
      bVar4 = true;
      if (local_248->m_primitiveType == TESSPRIMITIVETYPE_QUADS) {
        if (iVar12 != iVar20) {
          local_1b0.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
          std::operator<<((ostream *)&local_1b0.m_str,
                          "Failure: expected only white pixels (full-viewport quad)");
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0040ac61;
        }
      }
      else if (local_248->m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES) {
        iVar12 = iVar12 - iVar20 / 2;
        iVar18 = -iVar12;
        if (0 < iVar12) {
          iVar18 = iVar12;
        }
        if (iVar6 < iVar18) {
          poVar13 = &local_1b0.m_str;
          local_1b0.m_log = pTVar2;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar13);
          std::operator<<((ostream *)poVar13,
                          "Failure: wrong number of white pixels; expected approximately ");
          std::ostream::operator<<(poVar13,iVar20 / 2);
          tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          goto LAB_0040ac61;
        }
      }
    }
    else {
      if (iVar12 != 0) {
        local_1b0.m_log = pTVar2;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1b0.m_str);
        std::operator<<((ostream *)&local_1b0.m_str,
                        "Failure: expected only red pixels (everything culled)");
        tcu::MessageBuilder::operator<<(&local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
        goto LAB_0040ac61;
      }
      bVar4 = true;
    }
    tcu::Surface::~Surface(&rendered);
    WVar8 = WVar8 + WINDING_CW;
  } while (bVar4);
  pcVar15 = "Image verification failed";
  if (bVar5) {
    pcVar15 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((local_248->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)(byte)~bVar5,
             pcVar15);
  glu::ObjectWrapper::~ObjectWrapper(&vao.super_ObjectWrapper);
  return STOP;
}

Assistant:

WindingCase::IterateResult WindingCase::iterate (void)
{
	TestLog&						log							= m_testCtx.getLog();
	const RenderContext&			renderCtx					= m_context.getRenderContext();
	const RandomViewport			viewport					(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32					programGL					= m_program->getProgram();
	const glw::Functions&			gl							= renderCtx.getFunctions();
	const glu::VertexArray			vao							(renderCtx);

	bool							success						= true;

	setViewport(gl, viewport);
	gl.clearColor(1.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	gl.patchParameteri(GL_PATCH_VERTICES, 1);

	gl.enable(GL_CULL_FACE);

	gl.bindVertexArray(*vao);

	log << TestLog::Message << "Face culling enabled" << TestLog::EndMessage;

	for (int frontFaceWinding = 0; frontFaceWinding < WINDING_LAST; frontFaceWinding++)
	{
		log << TestLog::Message << "Setting glFrontFace(" << (frontFaceWinding == WINDING_CW ? "GL_CW" : "GL_CCW") << ")" << TestLog::EndMessage;

		gl.frontFace(frontFaceWinding == WINDING_CW ? GL_CW : GL_CCW);

		gl.clear(GL_COLOR_BUFFER_BIT);
		gl.drawArrays(GL_PATCHES, 0, 1);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");

		{
			const tcu::Surface rendered = getPixels(renderCtx, viewport);
			log << TestLog::Image("RenderedImage", "Rendered Image", rendered);

			{
				const int totalNumPixels		= rendered.getWidth()*rendered.getHeight();
				const int badPixelTolerance		= m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? 5*de::max(rendered.getWidth(), rendered.getHeight()) : 0;

				int numWhitePixels	= 0;
				int numRedPixels	= 0;
				for (int y = 0; y < rendered.getHeight();	y++)
				for (int x = 0; x < rendered.getWidth();	x++)
				{
					numWhitePixels	+= rendered.getPixel(x, y) == tcu::RGBA::white()	? 1 : 0;
					numRedPixels	+= rendered.getPixel(x, y) == tcu::RGBA::red()	? 1 : 0;
				}

				DE_ASSERT(numWhitePixels + numRedPixels <= totalNumPixels);

				log << TestLog::Message << "Note: got " << numWhitePixels << " white and " << numRedPixels << " red pixels" << TestLog::EndMessage;

				if (totalNumPixels - numWhitePixels - numRedPixels > badPixelTolerance)
				{
					log << TestLog::Message << "Failure: Got " << totalNumPixels - numWhitePixels - numRedPixels << " other than white or red pixels (maximum tolerance " << badPixelTolerance << ")" << TestLog::EndMessage;
					success = false;
					break;
				}

				if ((Winding)frontFaceWinding == m_winding)
				{
					if (m_primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					{
						if (de::abs(numWhitePixels - totalNumPixels/2) > badPixelTolerance)
						{
							log << TestLog::Message << "Failure: wrong number of white pixels; expected approximately " << totalNumPixels/2 << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else if (m_primitiveType == TESSPRIMITIVETYPE_QUADS)
					{
						if (numWhitePixels != totalNumPixels)
						{
							log << TestLog::Message << "Failure: expected only white pixels (full-viewport quad)" << TestLog::EndMessage;
							success = false;
							break;
						}
					}
					else
						DE_ASSERT(false);
				}
				else
				{
					if (numWhitePixels != 0)
					{
						log << TestLog::Message << "Failure: expected only red pixels (everything culled)" << TestLog::EndMessage;
						success = false;
						break;
					}
				}
			}
		}
	}

	m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image verification failed");
	return STOP;
}